

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void do_hide_dialog_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object window;
  Am_Object obj;
  
  obj.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&window,(Am_Slot_Flags)cmd);
  Am_Object::operator=(&obj,&window);
  Am_Object::~Am_Object(&window);
  window.data = (Am_Object_Data *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&obj,0x68);
  Am_Object::operator=(&window,pAVar1);
  Am_Object::Set((ushort)&window,true,0);
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&obj);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_hide_dialog, (Am_Object cmd))
{
  Am_Object obj; // the cancel button
  obj = cmd.Get_Owner();
  Am_Object window;
  window = obj.Get(Am_WINDOW);
  window.Set(Am_VISIBLE, false);
}